

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O2

void __thiscall
QtPromisePrivate::PromiseDataBase<QList<QString>,void(QList<QString>const&)>::
reject<QtPromisePrivate::PromiseError_const&>
          (PromiseDataBase<QList<QString>,void(QList<QString>const&)> *this,PromiseError *error)

{
  exception_ptr eStack_18;
  
  std::__exception_ptr::exception_ptr::exception_ptr(&eStack_18,&error->m_data);
  std::__exception_ptr::exception_ptr::operator=((exception_ptr *)(this + 0x50),&eStack_18);
  std::__exception_ptr::exception_ptr::~exception_ptr(&eStack_18);
  PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>::setSettled
            ((PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)> *)this);
  return;
}

Assistant:

void reject(E&& error)
    {
        Q_ASSERT(isPending());
        Q_ASSERT(m_error.isNull());
        m_error = PromiseError{std::forward<E>(error)};
        setSettled();
    }